

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumConstantTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumConstantTexture *this)

{
  SpectrumHandle *in_RCX;
  
  StringPrintf<pbrt::SpectrumHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ SpectrumConstantTexture value: %s ]",(char *)this,
             in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumConstantTexture::ToString() const {
    return StringPrintf("[ SpectrumConstantTexture value: %s ]", value);
}